

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
* Catch::Generators::
  makeGenerators<unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>>
            (unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
             *val,unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
                  *moreGenerators,
            unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
            *moreGenerators_1)

{
  unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
  *in_RDX;
  unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
  *in_RDI;
  unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
  *in_stack_ffffffffffffffa8;
  unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>
  *generator;
  
  generator = in_RDI;
  value<unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>>(in_RDX);
  makeGenerators<unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::portable_impl::uint128>>
            ((GeneratorWrapper<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
              *)generator,in_RDI,in_stack_ffffffffffffffa8);
  GeneratorWrapper<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
  ::~GeneratorWrapper((GeneratorWrapper<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
                       *)0x45584e);
  return (Generators<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::portable_impl::uint128>_>
          *)in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }